

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::ReceiveMessage
          (Coap *this,Endpoint *aEndpoint,shared_ptr<ot::commissioner::coap::Message> *aMessage,
          Error *error)

{
  char cVar1;
  Request *aResponse;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  allocator local_a1;
  writer write;
  string local_98;
  string local_78;
  pointer local_58;
  char *pcStack_50;
  size_t local_48;
  undefined8 local_40;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  code *local_30;
  
  if (error->mCode == kNone) {
    aResponse = (aMessage->
                super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    if (aResponse == (Request *)0x0) {
      __assert_fail("condition",
                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp"
                    ,0x277,
                    "void ot::commissioner::coap::Coap::ReceiveMessage(Endpoint &, std::shared_ptr<Message>, Error)"
                   );
    }
    aResponse->mEndpoint = aEndpoint;
    if ((byte)((aResponse->mHeader).mCode - 1) < 4) {
      HandleRequest(this,aResponse);
      return;
    }
    HandleResponse(this,aResponse);
    return;
  }
  std::__cxx11::string::string((string *)&local_78,"coap",&local_a1);
  local_58 = (pointer)CONCAT44(local_58._4_4_,string_type);
  from = "drop a CoAP message in bad format: {}";
  pcStack_50 = "drop a CoAP message in bad format: {}";
  local_48 = 0x25;
  local_40._0_4_ = 0;
  local_40._4_4_ = 1;
  local_30 = ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
  write.handler_ =
       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)&local_58;
  local_38 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_58;
  do {
    if (from == "") {
LAB_00143bca:
      local_58 = (error->mMessage)._M_dataplus._M_p;
      pcStack_50 = (char *)(error->mMessage)._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x25;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_98,(v10 *)"drop a CoAP message in bad format: {}",fmt,args);
      Log(kInfo,&local_78,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      return;
    }
    cVar1 = *from;
    to = from;
    while (cVar1 != '{') {
      to = to + 1;
      if (to == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&write,from,"");
        goto LAB_00143bca;
      }
      cVar1 = *to;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::writer::operator()(&write,from,to);
    from = ::fmt::v10::detail::
           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                     (to,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_58);
  } while( true );
}

Assistant:

Error Message::GetOption(ByteArray &aValue, OptionType aNumber) const
{
    Error error;
    auto  option = GetOption(aNumber);

    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("CoAP option {} not found", aNumber));

    aValue = option->GetOpaqueValue();

exit:
    return error;
}